

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_default_catalog.cpp
# Opt level: O1

void ConcurrentDefaultCatalog::ScanDefaultCatalog(DuckDB *db,bool *read_correct)

{
  char cVar1;
  long lVar2;
  char *__end;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  Connection con;
  long *local_80;
  bool *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  Connection local_50 [32];
  
  duckdb::Connection::Connection(local_50,db);
  *read_correct = true;
  lVar2 = 10;
  local_78 = read_correct;
  do {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"SELECT * FROM pg_class","");
    duckdb::Connection::Query((string *)&local_80);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_80);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (cVar1 != '\0') {
      *local_78 = false;
    }
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  duckdb::Connection::~Connection(local_50);
  return;
}

Assistant:

static void ScanDefaultCatalog(DuckDB *db, bool *read_correct) {
		Connection con(*db);
		*read_correct = true;
		for (idx_t i = 0; i < CONCURRENT_DEFAULT_ITERATION_COUNT; i++) {
			auto result = con.Query("SELECT * FROM pg_class");
			if (result->HasError()) {
				*read_correct = false;
			}
		}
	}